

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCArray NULLC::LongToStr(longlong *r)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  char cVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  NULLCArray NVar12;
  char buf [32];
  char local_38;
  char local_37 [31];
  
  if (r == (longlong *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar12 = (NULLCArray)ZEXT812(0);
  }
  else {
    lVar3 = *r;
    iVar9 = (int)lVar3 +
            ((int)(SUB168(SEXT816(lVar3) * SEXT816(0x6666666666666667),8) >> 2) -
            (SUB164(SEXT816(lVar3) * SEXT816(0x6666666666666667),0xc) >> 0x1f)) * -10;
    cVar5 = (char)iVar9;
    local_38 = -cVar5;
    if (0 < iVar9) {
      local_38 = cVar5;
    }
    local_38 = local_38 + '0';
    pcVar7 = local_37;
    pcVar8 = &local_38;
    for (lVar10 = lVar3; pcVar1 = pcVar7, 0x12 < lVar10 + 9U; lVar10 = lVar10 + lVar11) {
      lVar11 = -(lVar10 >> 0x3f);
      lVar10 = lVar10 / 10 + (lVar10 >> 0x3f);
      lVar2 = lVar10 + lVar11;
      auVar4 = SEXT816(lVar2) * SEXT816(0x6666666666666667);
      iVar9 = (int)lVar2 + ((int)(auVar4._8_8_ >> 2) - (auVar4._12_4_ >> 0x1f)) * -10;
      cVar5 = (char)iVar9;
      cVar6 = -cVar5;
      if (0 < iVar9) {
        cVar6 = cVar5;
      }
      *pcVar1 = cVar6 + '0';
      pcVar7 = pcVar1 + 1;
      pcVar8 = pcVar1;
    }
    pcVar7 = pcVar1;
    if (lVar3 < 0) {
      pcVar7 = pcVar8 + 2;
      *pcVar1 = '-';
    }
    NVar12 = AllocArray(1,((int)pcVar7 - (int)&local_38) + 1,2);
    pcVar8 = NVar12.ptr;
    do {
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar7 + -1;
      *pcVar8 = *pcVar1;
      pcVar8 = pcVar8 + 1;
    } while (pcVar7 != &local_38);
  }
  return NVar12;
}

Assistant:

NULLCArray NULLC::LongToStr(long long* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	long long number = *r;
	bool sign = 0;
	char buf[32];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(int(number % 10)) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(int(number % 10)) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}